

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# calibration.cpp
# Opt level: O2

Mat * drawPerspectivePoint(Mat *img,Mat *matrix)

{
  long lVar1;
  long lVar2;
  Mat *in_RDX;
  double (*padVar3) [3];
  long lVar4;
  long lVar5;
  double dVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  double dVar9;
  double dVar10;
  double myMatrix [3] [3];
  undefined8 local_b0;
  Matx<double,_4,_1> local_a8 [3];
  undefined4 local_40 [2];
  Mat *local_38;
  undefined8 local_30;
  
  cv::getPerspectiveTransform((Mat *)local_a8,(Point_ *)calibrationFirstArray,0x1108f0);
  cv::Mat::operator=(in_RDX,(Mat *)local_a8);
  cv::Mat::~Mat((Mat *)local_a8);
  lVar2 = *(long *)(in_RDX + 0x10);
  lVar1 = **(long **)(in_RDX + 0x48);
  padVar3 = myMatrix;
  for (lVar4 = 0; lVar4 != 3; lVar4 = lVar4 + 1) {
    for (lVar5 = 0; lVar5 != 3; lVar5 = lVar5 + 1) {
      (*padVar3)[lVar5] = *(double *)(lVar2 + lVar5 * 8);
    }
    lVar2 = lVar2 + lVar1;
    padVar3 = padVar3 + 1;
  }
  dVar6 = (double)toCalibrate.x;
  dVar10 = (double)toCalibrate.y;
  dVar9 = myMatrix[2][0] * dVar6 + myMatrix[2][1] * dVar10 + myMatrix[2][2];
  local_30 = 0;
  local_40[0] = 0x3010000;
  auVar7._0_8_ = dVar6 * myMatrix[0][0] + dVar10 * myMatrix[0][1] + myMatrix[0][2];
  auVar7._8_8_ = dVar6 * myMatrix[1][0] + dVar10 * myMatrix[1][1] + myMatrix[1][2];
  auVar8._8_8_ = dVar9;
  auVar8._0_8_ = dVar9;
  auVar8 = divpd(auVar7,auVar8);
  local_b0 = CONCAT44((int)auVar8._8_8_,(int)auVar8._0_8_);
  local_38 = matrix;
  cv::Matx<double,_4,_1>::Matx(local_a8);
  local_a8[0].val[0] = 0.0;
  local_a8[0].val[1] = 255.0;
  local_a8[0].val[2] = 0.0;
  local_a8[0].val[3] = 0.0;
  cv::circle(local_40,&local_b0,0,local_a8,1,8,0);
  cv::Mat::Mat(img,matrix);
  return img;
}

Assistant:

Mat drawPerspectivePoint(Mat img, Mat matrix){
    double myMatrix[3][3];
    matrix = getPerspectiveTransform(calibrationFirstArray, calibrationSecondArray);
    for(int i=0; i<3; i++)
        for(int j=0; j<3; j++){
            myMatrix[i][j] = matrix.at<double>(i,j);
        }
    double num = myMatrix[0][0]*toCalibrate.x+myMatrix[0][1]*toCalibrate.y+myMatrix[0][2];
    double dem = myMatrix[2][0]*toCalibrate.x+myMatrix[2][1]*toCalibrate.y+myMatrix[2][2];
    double new_position_x = num/dem;
    num = myMatrix[1][0]*toCalibrate.x+myMatrix[1][1]*toCalibrate.y+myMatrix[1][2];
    dem = myMatrix[2][0]*toCalibrate.x+myMatrix[2][1]*toCalibrate.y+myMatrix[2][2];
    double new_position_y = num/dem;
    circle(img,Point(new_position_x,new_position_y),0,Scalar( 0, 255, 0 ),1);
    return img;
}